

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_do(Curl_easy *data,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  IMAP *pIVar2;
  connectdata *conn;
  FILEPROTO *pFVar3;
  connectdata *pcVar4;
  bool bVar5;
  _Bool _Var6;
  CURLcode CVar7;
  int iVar8;
  curl_off_t cVar9;
  long lVar10;
  CURLcode unaff_EBP;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  Curl_easy *data_00;
  char *pcVar14;
  char *value;
  char *name;
  char *local_58;
  char *local_50;
  size_t local_48;
  Curl_easy *local_40;
  _Bool *local_38;
  
  *done = false;
  pIVar2 = (data->req).p.imap;
  pcVar13 = (data->state).up.path;
  lVar10 = 1;
  pcVar14 = pcVar13;
  local_40 = data;
  local_38 = done;
  do {
    pcVar11 = pcVar14;
    pcVar14 = pcVar11 + 1;
    _Var6 = imap_is_bchar(pcVar11[1]);
    lVar10 = lVar10 + -1;
  } while (_Var6);
  if (lVar10 == 0) {
    pIVar2->mailbox = (char *)0x0;
LAB_0013c8e0:
    while (*pcVar14 == ';') {
      pcVar13 = pcVar14 + 1;
      sVar12 = 0;
      pcVar14 = pcVar13;
LAB_0013c8f7:
      if (*pcVar14 == '\0') goto LAB_0013ca3c;
      if (*pcVar14 != '=') goto code_r0x0013c909;
      bVar5 = false;
      CVar7 = Curl_urldecode(pcVar13,sVar12,&local_50,(size_t *)0x0,REJECT_CTRL);
      if (CVar7 != CURLE_OK) goto LAB_0013ca43;
      pcVar13 = pcVar14 + 1;
      sVar12 = 0xffffffffffffffff;
      do {
        pcVar11 = pcVar14 + 1;
        pcVar14 = pcVar14 + 1;
        _Var6 = imap_is_bchar(*pcVar11);
        sVar12 = sVar12 + 1;
      } while (_Var6);
      CVar7 = Curl_urldecode(pcVar13,sVar12,&local_58,&local_48,REJECT_CTRL);
      if (CVar7 == CURLE_OK) {
        iVar8 = curl_strequal(local_50,"UIDVALIDITY");
        if ((iVar8 == 0) || (pIVar2->uidvalidity != (char *)0x0)) {
          iVar8 = curl_strequal(local_50,"UID");
          if ((iVar8 == 0) || (pIVar2->uid != (char *)0x0)) {
            iVar8 = curl_strequal(local_50,"MAILINDEX");
            if ((iVar8 == 0) || (pIVar2->mindex != (char *)0x0)) {
              iVar8 = curl_strequal(local_50,"SECTION");
              if ((iVar8 == 0) || (pIVar2->section != (char *)0x0)) {
                iVar8 = curl_strequal(local_50,"PARTIAL");
                if ((iVar8 == 0) || (pIVar2->partial != (char *)0x0)) {
                  (*Curl_cfree)(local_50);
                  (*Curl_cfree)(local_58);
LAB_0013ca3c:
                  bVar5 = false;
                  CVar7 = CURLE_URL_MALFORMAT;
                  goto LAB_0013ca43;
                }
                if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
                  local_58[local_48 - 1] = '\0';
                }
                pIVar2->partial = local_58;
              }
              else {
                if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
                  local_58[local_48 - 1] = '\0';
                }
                pIVar2->section = local_58;
              }
            }
            else {
              if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
                local_58[local_48 - 1] = '\0';
              }
              pIVar2->mindex = local_58;
            }
          }
          else {
            if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
              local_58[local_48 - 1] = '\0';
            }
            pIVar2->uid = local_58;
          }
        }
        else {
          if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
            local_58[local_48 - 1] = '\0';
          }
          pIVar2->uidvalidity = local_58;
        }
        local_58 = (char *)0x0;
        (*Curl_cfree)(local_50);
        (*Curl_cfree)(local_58);
        bVar5 = true;
        CVar7 = unaff_EBP;
      }
      else {
        (*Curl_cfree)(local_50);
        bVar5 = false;
      }
LAB_0013ca43:
      unaff_EBP = CVar7;
      if (!bVar5) goto LAB_0013cb6e;
    }
    if (((pIVar2->mailbox != (char *)0x0) && (pIVar2->uid == (char *)0x0)) &&
       (pIVar2->mindex == (char *)0x0)) {
      curl_url_get((local_40->state).uh,CURLUPART_QUERY,&pIVar2->query,0x40);
    }
    unaff_EBP = (uint)(*pcVar14 != '\0') * 3;
  }
  else {
    pcVar13 = pcVar13 + 1;
    if (*pcVar11 != '/') {
      pcVar11 = pcVar14;
    }
    unaff_EBP = Curl_urldecode(pcVar13,(long)pcVar11 - (long)pcVar13,&pIVar2->mailbox,(size_t *)0x0,
                               REJECT_CTRL);
    if (unaff_EBP == CURLE_OK) goto LAB_0013c8e0;
  }
LAB_0013cb6e:
  data_00 = local_40;
  if (unaff_EBP != CURLE_OK) {
    return unaff_EBP;
  }
  pcVar13 = (local_40->set).str[0x1c];
  if (pcVar13 == (char *)0x0) {
LAB_0013cbca:
    CVar7 = CURLE_OK;
  }
  else {
    pIVar2 = (local_40->req).p.imap;
    CVar7 = Curl_urldecode(pcVar13,0,&pIVar2->custom,(size_t *)0x0,REJECT_CTRL);
    if (CVar7 == CURLE_OK) {
      pcVar13 = pIVar2->custom;
      pcVar14 = pcVar13;
      for (; *pcVar13 != '\0'; pcVar13 = pcVar13 + 1) {
        if (*pcVar13 == ' ') {
          pcVar13 = (*Curl_cstrdup)(pcVar13);
          pIVar2->custom_params = pcVar13;
          *pcVar14 = '\0';
          CVar7 = CURLE_OUT_OF_MEMORY;
          if (pIVar2->custom_params != (char *)0x0) {
            CVar7 = CURLE_OK;
          }
          goto LAB_0013cbcc;
        }
        pcVar14 = pcVar14 + 1;
      }
      goto LAB_0013cbca;
    }
  }
LAB_0013cbcc:
  if (CVar7 != CURLE_OK) {
    return CVar7;
  }
  (data_00->req).size = -1;
  Curl_pgrsSetUploadCounter(data_00,0);
  Curl_pgrsSetDownloadCounter(data_00,0);
  Curl_pgrsSetUploadSize(data_00,-1);
  Curl_pgrsSetDownloadSize(data_00,-1);
  conn = data_00->conn;
  pIVar2 = (data_00->req).p.imap;
  if (((data_00->req).field_0xdb & 2) != 0) {
    pIVar2->transfer = PPTRANSFER_INFO;
  }
  *local_38 = false;
  if ((((pIVar2->mailbox == (char *)0x0) ||
       (pcVar13 = (conn->proto).imapc.mailbox, pcVar13 == (char *)0x0)) ||
      (iVar8 = curl_strequal(pIVar2->mailbox,pcVar13), iVar8 == 0)) ||
     (((pIVar2->uidvalidity != (char *)0x0 &&
       (pcVar13 = (conn->proto).ftpc.server_os, pcVar13 != (char *)0x0)) &&
      (iVar8 = curl_strequal(pIVar2->uidvalidity,pcVar13), iVar8 == 0)))) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  if ((((data_00->state).field_0x776 & 2) != 0) || ((data_00->set).mimepost.kind != MIMEKIND_NONE))
  {
    pFVar3 = (data_00->req).p.file;
    if (pFVar3->freepath == (char *)0x0) {
      Curl_failf(data_00,"Cannot APPEND without a mailbox.");
      CVar7 = CURLE_URL_MALFORMAT;
    }
    else {
      if ((data_00->set).mimepost.kind == MIMEKIND_NONE) {
        CVar7 = Curl_creader_set_fread(data_00,(data_00->state).infilesize);
        if (CVar7 != CURLE_OK) goto LAB_0013ce9b;
      }
      else {
        part = &(data_00->set).mimepost;
        puVar1 = &(data_00->set).mimepost.flags;
        *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
        curl_mime_headers(part,(data_00->set).headers,0);
        CVar7 = Curl_mime_prepare_headers(data_00,part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
        if (CVar7 == CURLE_OK) {
          pcVar13 = Curl_checkheaders(data_00,"Mime-Version",0xc);
          CVar7 = CURLE_OK;
          if (pcVar13 == (char *)0x0) {
            CVar7 = Curl_mime_add_header(&(data_00->set).mimepost.curlheaders,"Mime-Version: 1.0");
          }
        }
        if (CVar7 == CURLE_OK) {
          CVar7 = Curl_creader_set_mime(data_00,part);
        }
        if (CVar7 != CURLE_OK) goto LAB_0013ce9b;
        cVar9 = Curl_creader_client_length(data_00);
        (data_00->state).infilesize = cVar9;
      }
      if ((data_00->state).infilesize < 0) {
        Curl_failf(data_00,"Cannot APPEND with unknown input file size");
        CVar7 = CURLE_UPLOAD_FAILED;
      }
      else {
        pcVar13 = imap_atom(pFVar3->freepath,false);
        if (pcVar13 == (char *)0x0) {
          CVar7 = CURLE_OUT_OF_MEMORY;
        }
        else {
          CVar7 = imap_sendf(data_00,"APPEND %s (\\Seen) {%ld}",pcVar13,(data_00->state).infilesize)
          ;
          (*Curl_cfree)(pcVar13);
          if (CVar7 == CURLE_OK) {
            (data_00->conn->proto).imapc.state = IMAP_APPEND;
          }
        }
      }
    }
    goto LAB_0013ce9b;
  }
  pcVar13 = pIVar2->custom;
  if ((pcVar13 == (char *)0x0) || ((!bVar5 && (pIVar2->mailbox != (char *)0x0)))) {
    if (bVar5 && pcVar13 == (char *)0x0) {
      if ((pIVar2->uid != (char *)0x0) || (pIVar2->mindex != (char *)0x0)) {
        CVar7 = imap_perform_fetch(data_00);
        goto LAB_0013ce9b;
      }
      if (pIVar2->query != (char *)0x0) {
        CVar7 = imap_perform_search(data_00);
        goto LAB_0013ce9b;
      }
    }
    if ((!bVar5 && pIVar2->mailbox != (char *)0x0) &&
       ((((pcVar13 != (char *)0x0 || (pIVar2->uid != (char *)0x0)) ||
         (pIVar2->mindex != (char *)0x0)) || (pIVar2->query != (char *)0x0)))) {
      pcVar4 = data_00->conn;
      pFVar3 = (data_00->req).p.file;
      (*Curl_cfree)((pcVar4->proto).imapc.mailbox);
      (pcVar4->proto).ftpc.retr_size_saved = 0;
      (*Curl_cfree)((pcVar4->proto).ftpc.server_os);
      (pcVar4->proto).ftpc.server_os = (char *)0x0;
      pcVar13 = pFVar3->freepath;
      if (pcVar13 == (char *)0x0) {
        Curl_failf(data_00,"Cannot SELECT without a mailbox.");
        CVar7 = CURLE_URL_MALFORMAT;
      }
      else {
        pcVar13 = imap_atom(pcVar13,false);
        data_00 = local_40;
        if (pcVar13 == (char *)0x0) {
          CVar7 = CURLE_OUT_OF_MEMORY;
        }
        else {
          CVar7 = imap_sendf(local_40,"SELECT %s",pcVar13);
          (*Curl_cfree)(pcVar13);
          if (CVar7 == CURLE_OK) {
            (data_00->conn->proto).imapc.state = IMAP_SELECT;
          }
        }
      }
      goto LAB_0013ce9b;
    }
  }
  CVar7 = imap_perform_list(data_00);
LAB_0013ce9b:
  if (CVar7 == CURLE_OK) {
    CVar7 = imap_multi_statemach(data_00,local_38);
    Curl_conn_is_connected(conn,0);
  }
  if (CVar7 == CURLE_OK) {
    CVar7 = CURLE_OK;
    if ((*local_38 == true) && (((data_00->req).p.imap)->transfer != PPTRANSFER_BODY)) {
      Curl_xfer_setup_nop(data_00);
      CVar7 = CURLE_OK;
    }
  }
  return CVar7;
code_r0x0013c909:
  pcVar14 = pcVar14 + 1;
  sVar12 = sVar12 + 1;
  goto LAB_0013c8f7;
}

Assistant:

static CURLcode imap_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(data);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(data);
  if(result)
    return result;

  result = imap_regular_transfer(data, done);

  return result;
}